

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_table_base.hpp
# Opt level: O0

Coroutine * __thiscall
squall::TableBase::co_call<>(Coroutine *__return_storage_ptr__,TableBase *this,string *name)

{
  HSQUIRRELVM v;
  SQInteger top_00;
  SQInteger top;
  string *name_local;
  TableBase *this_local;
  
  v = handle(this);
  top_00 = sq_gettop(v);
  detail::call_setup<>(this->vm_,&this->tableobj_,name);
  Coroutine::Coroutine(__return_storage_ptr__,this->vm_,top_00);
  return __return_storage_ptr__;
}

Assistant:

Coroutine co_call(const string& name, T... args) {
        SQInteger top = sq_gettop(handle());
        detail::call_setup(vm_, tableobj_, name, args...);
        return Coroutine(vm_, top);
    }